

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::is_member_builtin
          (Compiler *this,SPIRType *type,uint32_t index,BuiltIn *builtin)

{
  Meta *pMVar1;
  Vector<Decoration> *this_00;
  size_t sVar2;
  Decoration *pDVar3;
  Vector<Decoration> *memb;
  Meta *type_meta;
  BuiltIn *builtin_local;
  uint32_t index_local;
  SPIRType *type_local;
  Compiler *this_local;
  
  pMVar1 = ParsedIR::find_meta(&this->ir,(ID)(type->super_IVariant).self.id);
  if (pMVar1 != (Meta *)0x0) {
    this_00 = &pMVar1->members;
    sVar2 = VectorView<spirv_cross::Meta::Decoration>::size
                      (&this_00->super_VectorView<spirv_cross::Meta::Decoration>);
    if ((index < sVar2) &&
       (pDVar3 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                           (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)index),
       (pDVar3->builtin & 1U) != 0)) {
      if (builtin != (BuiltIn *)0x0) {
        pDVar3 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                           (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)index);
        *builtin = pDVar3->builtin_type;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Compiler::is_member_builtin(const SPIRType &type, uint32_t index, BuiltIn *builtin) const
{
	auto *type_meta = ir.find_meta(type.self);

	if (type_meta)
	{
		auto &memb = type_meta->members;
		if (index < memb.size() && memb[index].builtin)
		{
			if (builtin)
				*builtin = memb[index].builtin_type;
			return true;
		}
	}

	return false;
}